

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O1

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createUnknownCall(LLVMPointerGraphBuilder *this)

{
  PSNode *pPVar1;
  
  pPVar1 = PointerGraph::create<(dg::pta::PSNodeType)8>((PointerGraph *)this);
  pPVar1->pairedNode = pPVar1;
  PointerIdPointsToSet::add(&pPVar1->pointsTo,(Pointer *)&UnknownPointer);
  return pPVar1;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createUnknownCall() {
    // This assertion must not hold if the call is wrapped
    // inside bitcast - it defaults to int, but is bitcased
    // to pointer
    // assert(CInst->getType()->isPointerTy());
    PSNode *call = PS.create<PSNodeType::CALL>();
    call->setPairedNode(call);

    // the only thing that the node will point at
    call->addPointsTo(UnknownPointer);

    return call;
}